

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fbjava.cpp
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__rhs;
  IMaster *pIVar2;
  undefined8 uVar3;
  pointer pbVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  jint jVar8;
  pointer aStatus;
  IConfigManager *pIVar9;
  pointer pIVar10;
  pointer pIVar11;
  istream *piVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  runtime_error *prVar16;
  DynLibrary *this;
  pointer pDVar17;
  size_type sVar18;
  iterator iVar19;
  iterator iVar20;
  iterator iVar21;
  _jclass *p_Var22;
  jmethodID methodID;
  path *ppVar23;
  jobjectArray ref;
  reference pbVar24;
  jstring p_Var25;
  _jobjectArray *p_Var26;
  jobject p_Var27;
  _jobject *p_Var28;
  _jstring *p_Var29;
  _jstring *p_Var30;
  bool local_a4a;
  undefined1 local_8f8 [8];
  JniRef<_jobject_*> masterPointer;
  jmethodID jnaPointerInitId;
  JniRef<_jclass_*> jnaPointerCls;
  JniRef<_jstring_*> jnaPointerName;
  jlong jmaster;
  JniRef<_jstring_*> fbclientLibrary;
  undefined1 local_868 [8];
  JniRef<_jstring_*> nativeLibrary;
  jmethodID mainInitializeId;
  JniRef<_jclass_*> mainCls;
  JniRef<_jobject_*> classLoader;
  JniRef<_jstring_*> mainClassName;
  JniRef<_jobject_*> url;
  JniRef<_jstring_*> str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *classPathEntry;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  undefined1 local_7a8 [4];
  uint i;
  JniRef<_jobjectArray_*> urlArray;
  string local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  string local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  allocator<char> local_6e1;
  undefined1 local_6e0 [8];
  string protocol;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  path local_698;
  undefined1 local_670 [8];
  string name;
  directory_entry *dirEntry;
  undefined1 local_638 [8];
  directory_iterator __end1_1;
  undefined1 local_618 [8];
  directory_iterator __begin1_1;
  directory_iterator *__range1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  classPathEntries;
  jmethodID urlClassLoaderLoadClassId;
  jmethodID urlClassLoaderInitId;
  JniRef<_jclass_*> urlClassLoaderCls;
  jmethodID urlInitId;
  JniRef<_jclass_*> urlCls;
  JNIEnv *env;
  undefined1 local_580 [4];
  jint jvmStatus;
  JNIEnv *dummyEnv;
  JavaVM_ *pJStack_570;
  jsize jvmCount;
  JavaVM *jvm;
  JavaVMInitArgs vmArgs;
  int jvmVersion;
  allocator<JavaVMOption> local_519;
  undefined1 local_518 [8];
  vector<JavaVMOption,_std::allocator<JavaVMOption>_> vmOptions;
  _func_jint_JavaVM_ptr_ptr_void_ptr_ptr_void_ptr *createJavaVM;
  _func_jint_JavaVM_ptr_ptr_jsize_jsize_ptr *getCreatedJavaVMs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  undefined1 local_4a8 [8];
  string jvmLibrary;
  char *javaHomeEnv;
  path local_458;
  path local_430;
  undefined1 local_408 [8];
  path libDir;
  Dl_info dlInfo;
  string fbclientName;
  path libFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string jnaLibPath;
  FbException *anon_var_0;
  undefined1 local_2f0 [8];
  string line;
  ifstream input;
  unique_ptr<Firebird::IConfigEntry,_FbDeleter> local_c8;
  FbUniquePtr<Firebird::IConfigEntry> entry_1;
  FbUniquePtr<Firebird::IConfigEntry> entry;
  FbUniquePtr<Firebird::IConfig> config;
  IConfigManager *configManager;
  ThrowStatusWrapper st;
  FbUniquePtr<Firebird::IStatus> status;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string jnaLibPathOpt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  jvmArgs;
  string javaHome;
  
  std::__cxx11::string::string
            ((string *)
             &jvmArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&jnaLibPathOpt.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"-Djna.library.path=",&local_61);
  std::allocator<char>::~allocator(&local_61);
  Firebird::IMaster::getStatus(master);
  fbUnique<Firebird::IStatus>
            ((IStatus *)&st.super_BaseStatusWrapper<Firebird::ThrowStatusWrapper>.dirty);
  aStatus = std::unique_ptr<Firebird::IStatus,_FbDeleter>::get
                      ((unique_ptr<Firebird::IStatus,_FbDeleter> *)
                       &st.super_BaseStatusWrapper<Firebird::ThrowStatusWrapper>.dirty);
  Firebird::ThrowStatusWrapper::ThrowStatusWrapper((ThrowStatusWrapper *)&configManager,aStatus);
  pIVar9 = Firebird::IMaster::getConfigManager(master);
  if (pIVar9 != (IConfigManager *)0x0) {
    Firebird::IConfigManager::getPluginConfig(pIVar9,"JAVA");
    fbUnique<Firebird::IConfig>((IConfig *)&entry);
    bVar6 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&entry);
    if (bVar6) {
      pIVar10 = std::unique_ptr<Firebird::IConfig,_FbDeleter>::operator->
                          ((unique_ptr<Firebird::IConfig,_FbDeleter> *)&entry);
      Firebird::IConfig::find<Firebird::ThrowStatusWrapper>
                (pIVar10,(ThrowStatusWrapper *)&configManager,"JavaHome");
      fbUnique<Firebird::IConfigEntry>((IConfigEntry *)&entry_1);
      bVar6 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&entry_1);
      if (bVar6) {
        pIVar11 = std::unique_ptr<Firebird::IConfigEntry,_FbDeleter>::operator->(&entry_1);
        pcVar13 = Firebird::IConfigEntry::getValue(pIVar11);
        std::__cxx11::string::operator=
                  ((string *)
                   &jvmArgs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar13);
      }
      std::unique_ptr<Firebird::IConfigEntry,_FbDeleter>::~unique_ptr(&entry_1);
      pIVar10 = std::unique_ptr<Firebird::IConfig,_FbDeleter>::operator->
                          ((unique_ptr<Firebird::IConfig,_FbDeleter> *)&entry);
      Firebird::IConfig::find<Firebird::ThrowStatusWrapper>
                (pIVar10,(ThrowStatusWrapper *)&configManager,"JvmArgsFile");
      fbUnique<Firebird::IConfigEntry>((IConfigEntry *)&local_c8);
      bVar6 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_c8);
      if (bVar6) {
        pIVar11 = std::unique_ptr<Firebird::IConfigEntry,_FbDeleter>::operator->(&local_c8);
        pcVar13 = Firebird::IConfigEntry::getValue(pIVar11);
        std::ifstream::ifstream((ifstream *)((long)&line.field_2 + 8),pcVar13,8);
        std::__cxx11::string::string((string *)local_2f0);
        while( true ) {
          piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)(line.field_2._M_local_buf + 8),(string *)local_2f0);
          bVar6 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar12 + *(long *)(*(long *)piVar12 + -0x18)));
          if (!bVar6) break;
          trim((string *)&anon_var_0,(string *)local_2f0);
          std::__cxx11::string::operator=((string *)local_2f0,(string *)&anon_var_0);
          std::__cxx11::string::~string((string *)&anon_var_0);
          uVar15 = std::__cxx11::string::empty((string *)local_2f0);
          if (((uVar15 & 1) == 0) &&
             (pcVar13 = (char *)std::__cxx11::string::operator[]((string *)local_2f0,0),
             *pcVar13 != '#')) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&jnaLibPathOpt.field_2 + 8),(value_type *)local_2f0);
          }
        }
        std::__cxx11::string::~string((string *)local_2f0);
        std::ifstream::~ifstream((ifstream *)(line.field_2._M_local_buf + 8));
      }
      std::unique_ptr<Firebird::IConfigEntry,_FbDeleter>::~unique_ptr(&local_c8);
    }
    std::unique_ptr<Firebird::IConfig,_FbDeleter>::~unique_ptr
              ((unique_ptr<Firebird::IConfig,_FbDeleter> *)&entry);
  }
  Firebird::ThrowStatusWrapper::~ThrowStatusWrapper((ThrowStatusWrapper *)&configManager);
  std::unique_ptr<Firebird::IStatus,_FbDeleter>::~unique_ptr
            ((unique_ptr<Firebird::IStatus,_FbDeleter> *)
             &st.super_BaseStatusWrapper<Firebird::ThrowStatusWrapper>.dirty);
  std::__cxx11::string::string((string *)&__range1);
  pIVar9 = Firebird::IMaster::getConfigManager(master);
  pcVar13 = Firebird::IConfigManager::getDirectory(pIVar9,3);
  std::__cxx11::string::operator=((string *)&__range1,pcVar13);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&jnaLibPathOpt.field_2 + 8);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(pvVar1);
  arg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(pvVar1);
  while (bVar6 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&arg), bVar6) {
    pbVar24 = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1);
    uVar15 = std::__cxx11::string::length((string *)pbVar24);
    uVar14 = std::__cxx11::string::length((string *)local_60);
    if (uVar14 <= uVar15) {
      uVar15 = std::__cxx11::string::length((string *)local_60);
      iVar7 = std::__cxx11::string::compare((string *)pbVar24,0,uVar15,(string *)local_60);
      if (iVar7 == 0) {
        std::__cxx11::string::append((string *)pbVar24,1,':');
        std::__cxx11::string::append((string *)pbVar24,(string *)&__range1);
        std::__cxx11::string::clear((string *)&__range1);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  uVar15 = std::__cxx11::string::empty((string *)&__range1);
  if ((uVar15 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &libFile._M_cmpts,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&jnaLibPathOpt.field_2 + 8),(value_type *)&libFile._M_cmpts);
    std::__cxx11::string::~string((string *)&libFile._M_cmpts);
  }
  std::filesystem::__cxx11::path::path((path *)((long)&fbclientName.field_2 + 8));
  std::__cxx11::string::string((string *)&dlInfo.dli_saddr);
  iVar7 = dladdr(init,&libDir._M_cmpts);
  if (iVar7 == 0) {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar16,"Cannot get the plugin library path.");
    __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::filesystem::__cxx11::path::operator=
            ((path *)((long)&fbclientName.field_2 + 8),(char **)&libDir._M_cmpts);
  iVar7 = dladdr(master,&libDir._M_cmpts);
  if (iVar7 == 0) {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar16,"Cannot get the fbclient library path.");
    __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::operator=((string *)&dlInfo.dli_saddr,(char *)libDir._32_8_);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
            ((path *)&javaHomeEnv,(char (*) [4])0x1e31ec,auto_format);
  std::filesystem::__cxx11::operator/((path *)local_408,&local_430,(path *)&javaHomeEnv);
  std::filesystem::__cxx11::path::~path((path *)&javaHomeEnv);
  std::filesystem::__cxx11::path::~path(&local_430);
  std::filesystem::__cxx11::path::~path(&local_458);
  uVar15 = std::__cxx11::string::empty
                     ((string *)
                      &jvmArgs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (((uVar15 & 1) != 0) &&
     (jvmLibrary.field_2._8_8_ = getenv("JAVA_HOME"),
     (char *)jvmLibrary.field_2._8_8_ != (char *)0x0)) {
    std::__cxx11::string::operator=
              ((string *)
               &jvmArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(char *)jvmLibrary.field_2._8_8_)
    ;
  }
  uVar15 = std::__cxx11::string::empty
                     ((string *)
                      &jvmArgs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((uVar15 & 1) != 0) {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar16,"JAVA_HOME environment variable is not defined.");
    __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  findJvmLibrary((string *)local_4a8,
                 (string *)
                 &jvmArgs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar15 = std::__cxx11::string::empty((string *)local_4a8);
  if ((uVar15 & 1) != 0) {
    getCreatedJavaVMs._7_1_ = 1;
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_4e8,"No JVM library found in \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &jvmArgs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator+(&local_4c8,&local_4e8,"\'.");
    std::runtime_error::runtime_error(prVar16,(string *)&local_4c8);
    getCreatedJavaVMs._7_1_ = 0;
    __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this = (DynLibrary *)operator_new(0x28);
  DynLibrary::DynLibrary(this,(string *)local_4a8);
  std::unique_ptr<DynLibrary,_std::default_delete<DynLibrary>_>::reset(&library,this);
  pDVar17 = std::unique_ptr<DynLibrary,_std::default_delete<DynLibrary>_>::operator->(&library);
  DynLibrary::findSymbol<int(*)(JavaVM_**,int,int*)>
            (pDVar17,"JNI_GetCreatedJavaVMs",(_func_int_JavaVM__ptr_ptr_int_int_ptr **)&createJavaVM
            );
  pDVar17 = std::unique_ptr<DynLibrary,_std::default_delete<DynLibrary>_>::operator->(&library);
  DynLibrary::findSymbol<int(*)(JavaVM_**,void**,void*)>
            (pDVar17,"JNI_CreateJavaVM",
             (_func_int_JavaVM__ptr_ptr_void_ptr_ptr_void_ptr **)
             &vmOptions.super__Vector_base<JavaVMOption,_std::allocator<JavaVMOption>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sVar18 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&jnaLibPathOpt.field_2 + 8));
  std::allocator<JavaVMOption>::allocator(&local_519);
  std::vector<JavaVMOption,_std::allocator<JavaVMOption>_>::vector
            ((vector<JavaVMOption,_std::allocator<JavaVMOption>_> *)local_518,sVar18,&local_519);
  std::allocator<JavaVMOption>::~allocator(&local_519);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&jnaLibPathOpt.field_2 + 8);
  iVar19 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(pvVar1);
  iVar20 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(pvVar1);
  iVar21 = std::vector<JavaVMOption,_std::allocator<JavaVMOption>_>::begin
                     ((vector<JavaVMOption,_std::allocator<JavaVMOption>_> *)local_518);
  std::
  transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<JavaVMOption*,std::vector<JavaVMOption,std::allocator<JavaVMOption>>>,init()::__0>
            (iVar19._M_current,iVar20._M_current,iVar21._M_current);
  vmArgs._20_4_ = 0x10004;
  vmArgs.version = 0;
  vmArgs.nOptions = 0;
  vmArgs.options = (JavaVMOption *)0x0;
  jvm = (JavaVM *)0x10004;
  sVar18 = std::vector<JavaVMOption,_std::allocator<JavaVMOption>_>::size
                     ((vector<JavaVMOption,_std::allocator<JavaVMOption>_> *)local_518);
  jvm = (JavaVM *)CONCAT44((int)sVar18,jvm._0_4_);
  vmArgs._0_8_ = std::vector<JavaVMOption,_std::allocator<JavaVMOption>_>::data
                           ((vector<JavaVMOption,_std::allocator<JavaVMOption>_> *)local_518);
  vmArgs.options = (JavaVMOption *)((ulong)vmArgs.options & 0xffffffffffffff00);
  pJStack_570 = (JavaVM_ *)0x0;
  dummyEnv._4_4_ = 0;
  (*createJavaVM)(&stack0xfffffffffffffa90,(void **)0x1,(void *)((long)&dummyEnv + 4));
  if ((dummyEnv._4_4_ == 0) &&
     (iVar7 = (*(code *)vmOptions.super__Vector_base<JavaVMOption,_std::allocator<JavaVMOption>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage)
                        (&stack0xfffffffffffffa90,local_580,&jvm), iVar7 != 0)) {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar16,"Error creating JVM.");
    __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  jVar8 = JavaVM_::GetEnv(pJStack_570,(void **)&urlCls.global,0x10004);
  if ((jVar8 == -2) &&
     (jVar8 = JavaVM_::AttachCurrentThread(pJStack_570,(void **)&urlCls.global,(void *)0x0),
     jVar8 != 0)) {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar16,"Cannot attach the current thread to the JVM.");
    __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  findClass((JniRef<_jclass_*> *)&urlInitId,(JNIEnv *)urlCls._16_8_,"java/net/URL",false);
  uVar3 = urlCls._16_8_;
  p_Var22 = JniRef<_jclass_*>::get((JniRef<_jclass_*> *)&urlInitId);
  urlClassLoaderCls._16_8_ = getMethodID((JNIEnv *)uVar3,p_Var22,"<init>","(Ljava/lang/String;)V");
  findClass((JniRef<_jclass_*> *)&urlClassLoaderInitId,(JNIEnv *)urlCls._16_8_,
            "java/net/URLClassLoader",false);
  uVar3 = urlCls._16_8_;
  p_Var22 = JniRef<_jclass_*>::get((JniRef<_jclass_*> *)&urlClassLoaderInitId);
  methodID = getMethodID((JNIEnv *)uVar3,p_Var22,"<init>","([Ljava/net/URL;)V");
  uVar3 = urlCls._16_8_;
  p_Var22 = JniRef<_jclass_*>::get((JniRef<_jclass_*> *)&urlClassLoaderInitId);
  classPathEntries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)getMethodID((JNIEnv *)uVar3,p_Var22,"loadClass",
                            "(Ljava/lang/String;Z)Ljava/lang/Class;");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1_1);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__begin1_1._M_dir._M_refcount,(path *)local_408);
  __rhs = &__begin1_1._M_dir._M_refcount;
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__end1_1._M_dir._M_refcount,(directory_iterator *)__rhs);
  std::filesystem::__cxx11::begin
            ((__cxx11 *)local_618,(directory_iterator *)&__end1_1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__end1_1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&dirEntry,(directory_iterator *)__rhs);
  std::filesystem::__cxx11::end((directory_iterator *)local_638);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)&dirEntry)
  ;
  while (bVar6 = std::filesystem::__cxx11::operator!=
                           ((directory_iterator *)local_618,(directory_iterator *)local_638), bVar6)
  {
    name.field_2._8_8_ =
         std::filesystem::__cxx11::directory_iterator::operator*((directory_iterator *)local_618);
    bVar6 = std::filesystem::__cxx11::directory_entry::is_regular_file
                      ((directory_entry *)name.field_2._8_8_);
    if (bVar6) {
      ppVar23 = std::filesystem::__cxx11::directory_entry::path
                          ((directory_entry *)name.field_2._8_8_);
      std::filesystem::__cxx11::path::filename(&local_698,ppVar23);
      std::filesystem::__cxx11::path::string((string *)local_670,&local_698);
      std::filesystem::__cxx11::path::~path(&local_698);
      uVar15 = std::__cxx11::string::length((string *)local_670);
      protocol.field_2._M_local_buf[0xf] = '\0';
      local_a4a = false;
      if (4 < uVar15) {
        std::__cxx11::string::length((string *)local_670);
        std::__cxx11::string::substr((ulong)&local_6b8,(ulong)local_670);
        protocol.field_2._M_local_buf[0xf] = '\x01';
        local_a4a = std::operator==(&local_6b8,".jar");
      }
      if ((protocol.field_2._M_local_buf[0xf] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_6b8);
      }
      if (local_a4a != false) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_6e0,"file://",&local_6e1)
        ;
        std::allocator<char>::~allocator(&local_6e1);
        ppVar23 = std::filesystem::__cxx11::directory_entry::path
                            ((directory_entry *)name.field_2._8_8_);
        std::filesystem::__cxx11::path::string(&local_728,ppVar23);
        std::operator+(&local_708,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_6e0,&local_728);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1_1,&local_708);
        std::__cxx11::string::~string((string *)&local_708);
        std::__cxx11::string::~string((string *)&local_728);
        std::__cxx11::string::~string((string *)local_6e0);
      }
      std::__cxx11::string::~string((string *)local_670);
    }
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)local_618);
  }
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_638)
  ;
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_618)
  ;
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__begin1_1._M_dir._M_refcount);
  bVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1_1);
  uVar3 = urlCls._16_8_;
  if (bVar6) {
    urlArray._23_1_ = 1;
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::filesystem::__cxx11::path::string(&local_788,(path *)local_408);
    std::operator+(&local_768,"Cannot set the classpath. Directory \'",&local_788);
    std::operator+(&local_748,&local_768,"\' does not exist.");
    std::runtime_error::runtime_error(prVar16,(string *)&local_748);
    urlArray._23_1_ = 0;
    __cxa_throw(prVar16,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar18 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1_1);
  p_Var22 = JniRef<_jclass_*>::get((JniRef<_jclass_*> *)&urlInitId);
  ref = JNIEnv_::NewObjectArray((JNIEnv_ *)uVar3,(jsize)sVar18,p_Var22,(jobject)0x0);
  jniLocalRef<_jobjectArray*>((JniRef<_jobjectArray_*> *)local_7a8,(JNIEnv *)uVar3,ref);
  bVar6 = JniRef<_jobjectArray_*>::operator!((JniRef<_jobjectArray_*> *)local_7a8);
  if (bVar6) {
    checkJavaException((JNIEnv *)urlCls._16_8_);
  }
  __range1_2._4_4_ = 0;
  __end1_2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1_1);
  classPathEntry =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1_1);
  while (bVar6 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&classPathEntry), uVar3 = urlCls._16_8_, bVar6) {
    pbVar24 = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1_2);
    uVar3 = urlCls._16_8_;
    pcVar13 = (char *)std::__cxx11::string::c_str((string *)pbVar24);
    p_Var25 = JNIEnv_::NewStringUTF((JNIEnv_ *)uVar3,pcVar13);
    jniLocalRef<_jstring*>((JniRef<_jstring_*> *)&url.global,(JNIEnv *)uVar3,p_Var25);
    bVar6 = JniRef<_jstring_*>::operator!((JniRef<_jstring_*> *)&url.global);
    if (bVar6) {
      checkJavaException((JNIEnv *)urlCls._16_8_);
    }
    uVar5 = urlCls._16_8_;
    p_Var22 = JniRef<_jclass_*>::get((JniRef<_jclass_*> *)&urlInitId);
    uVar3 = urlClassLoaderCls._16_8_;
    p_Var29 = JniRef<_jstring_*>::get((JniRef<_jstring_*> *)&url.global);
    p_Var27 = JNIEnv_::NewObject((JNIEnv_ *)uVar5,p_Var22,(jmethodID)uVar3,p_Var29);
    jniLocalRef<_jobject*>((JniRef<_jobject_*> *)&mainClassName.global,(JNIEnv *)uVar5,p_Var27);
    bVar6 = JniRef<_jobject_*>::operator!((JniRef<_jobject_*> *)&mainClassName.global);
    if (bVar6) {
      checkJavaException((JNIEnv *)urlCls._16_8_);
    }
    uVar3 = urlCls._16_8_;
    p_Var26 = JniRef<_jobjectArray_*>::get((JniRef<_jobjectArray_*> *)local_7a8);
    p_Var28 = JniRef<_jobject_*>::get((JniRef<_jobject_*> *)&mainClassName.global);
    JNIEnv_::SetObjectArrayElement((JNIEnv_ *)uVar3,p_Var26,__range1_2._4_4_,p_Var28);
    checkJavaException((JNIEnv *)urlCls._16_8_);
    JniRef<_jobject_*>::~JniRef((JniRef<_jobject_*> *)&mainClassName.global);
    JniRef<_jstring_*>::~JniRef((JniRef<_jstring_*> *)&url.global);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_2);
    __range1_2._4_4_ = __range1_2._4_4_ + 1;
  }
  p_Var25 = JNIEnv_::NewStringUTF((JNIEnv_ *)urlCls._16_8_,"org.firebirdsql.fbjava.impl.Main");
  jniLocalRef<_jstring*>((JniRef<_jstring_*> *)&classLoader.global,(JNIEnv *)uVar3,p_Var25);
  bVar6 = JniRef<_jstring_*>::operator!((JniRef<_jstring_*> *)&classLoader.global);
  if (bVar6) {
    checkJavaException((JNIEnv *)urlCls._16_8_);
  }
  uVar3 = urlCls._16_8_;
  p_Var22 = JniRef<_jclass_*>::get((JniRef<_jclass_*> *)&urlClassLoaderInitId);
  p_Var26 = JniRef<_jobjectArray_*>::get((JniRef<_jobjectArray_*> *)local_7a8);
  p_Var27 = JNIEnv_::NewObject((JNIEnv_ *)uVar3,p_Var22,methodID,p_Var26);
  jniLocalRef<_jobject*>((JniRef<_jobject_*> *)&mainCls.global,(JNIEnv *)uVar3,p_Var27);
  bVar6 = JniRef<_jobject_*>::operator!((JniRef<_jobject_*> *)&mainCls.global);
  if (bVar6) {
    checkJavaException((JNIEnv *)urlCls._16_8_);
  }
  uVar3 = urlCls._16_8_;
  p_Var28 = JniRef<_jobject_*>::get((JniRef<_jobject_*> *)&mainCls.global);
  pbVar4 = classPathEntries.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  p_Var29 = JniRef<_jstring_*>::get((JniRef<_jstring_*> *)&classLoader.global);
  p_Var27 = JNIEnv_::CallObjectMethod((JNIEnv_ *)uVar3,p_Var28,(jmethodID)pbVar4,p_Var29,1);
  jniLocalRef<_jclass*>((JniRef<_jclass_*> *)&mainInitializeId,(JNIEnv *)uVar3,(_jclass *)p_Var27);
  bVar6 = JniRef<_jclass_*>::operator!((JniRef<_jclass_*> *)&mainInitializeId);
  if (bVar6) {
    checkJavaException((JNIEnv *)urlCls._16_8_);
  }
  uVar3 = urlCls._16_8_;
  p_Var22 = JniRef<_jclass_*>::get((JniRef<_jclass_*> *)&mainInitializeId);
  nativeLibrary._16_8_ =
       getStaticMethodID((JNIEnv *)uVar3,p_Var22,"initialize",
                         "(Ljava/lang/String;Ljava/lang/String;Lcom/sun/jna/Pointer;)V");
  checkJavaException((JNIEnv *)urlCls._16_8_);
  uVar3 = urlCls._16_8_;
  std::filesystem::__cxx11::path::string
            ((string *)&fbclientLibrary.global,(path *)((long)&fbclientName.field_2 + 8));
  pcVar13 = (char *)std::__cxx11::string::c_str((string *)&fbclientLibrary.global);
  p_Var25 = JNIEnv_::NewStringUTF((JNIEnv_ *)uVar3,pcVar13);
  jniLocalRef<_jstring*>((JniRef<_jstring_*> *)local_868,(JNIEnv *)uVar3,p_Var25);
  std::__cxx11::string::~string((string *)&fbclientLibrary.global);
  bVar6 = JniRef<_jstring_*>::operator!((JniRef<_jstring_*> *)local_868);
  if (bVar6) {
    checkJavaException((JNIEnv *)urlCls._16_8_);
  }
  uVar3 = urlCls._16_8_;
  pcVar13 = (char *)std::__cxx11::string::c_str((string *)&dlInfo.dli_saddr);
  p_Var25 = JNIEnv_::NewStringUTF((JNIEnv_ *)uVar3,pcVar13);
  jniLocalRef<_jstring*>((JniRef<_jstring_*> *)&jmaster,(JNIEnv *)uVar3,p_Var25);
  bVar6 = JniRef<_jstring_*>::operator!((JniRef<_jstring_*> *)&jmaster);
  if (bVar6) {
    checkJavaException((JNIEnv *)urlCls._16_8_);
  }
  uVar3 = urlCls._16_8_;
  pIVar2 = master;
  p_Var25 = JNIEnv_::NewStringUTF((JNIEnv_ *)urlCls._16_8_,"com.sun.jna.Pointer");
  jniLocalRef<_jstring*>((JniRef<_jstring_*> *)&jnaPointerCls.global,(JNIEnv *)uVar3,p_Var25);
  bVar6 = JniRef<_jstring_*>::operator!((JniRef<_jstring_*> *)&jnaPointerCls.global);
  if (bVar6) {
    checkJavaException((JNIEnv *)urlCls._16_8_);
  }
  uVar3 = urlCls._16_8_;
  p_Var28 = JniRef<_jobject_*>::get((JniRef<_jobject_*> *)&mainCls.global);
  pbVar4 = classPathEntries.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  p_Var29 = JniRef<_jstring_*>::get((JniRef<_jstring_*> *)&jnaPointerCls.global);
  p_Var27 = JNIEnv_::CallObjectMethod((JNIEnv_ *)uVar3,p_Var28,(jmethodID)pbVar4,p_Var29,1);
  jniLocalRef<_jclass*>((JniRef<_jclass_*> *)&jnaPointerInitId,(JNIEnv *)uVar3,(_jclass *)p_Var27);
  bVar6 = JniRef<_jclass_*>::operator!((JniRef<_jclass_*> *)&jnaPointerInitId);
  if (bVar6) {
    checkJavaException((JNIEnv *)urlCls._16_8_);
  }
  uVar3 = urlCls._16_8_;
  p_Var22 = JniRef<_jclass_*>::get((JniRef<_jclass_*> *)&jnaPointerInitId);
  masterPointer._16_8_ = getMethodID((JNIEnv *)uVar3,p_Var22,"<init>","(J)V");
  uVar3 = urlCls._16_8_;
  p_Var22 = JniRef<_jclass_*>::get((JniRef<_jclass_*> *)&jnaPointerInitId);
  p_Var27 = JNIEnv_::NewObject((JNIEnv_ *)uVar3,p_Var22,(jmethodID)masterPointer._16_8_,pIVar2);
  jniLocalRef<_jobject*>((JniRef<_jobject_*> *)local_8f8,(JNIEnv *)uVar3,p_Var27);
  bVar6 = JniRef<_jobject_*>::operator!((JniRef<_jobject_*> *)local_8f8);
  if (bVar6) {
    checkJavaException((JNIEnv *)urlCls._16_8_);
  }
  uVar5 = urlCls._16_8_;
  p_Var22 = JniRef<_jclass_*>::get((JniRef<_jclass_*> *)&mainInitializeId);
  uVar3 = nativeLibrary._16_8_;
  p_Var29 = JniRef<_jstring_*>::get((JniRef<_jstring_*> *)local_868);
  p_Var30 = JniRef<_jstring_*>::get((JniRef<_jstring_*> *)&jmaster);
  p_Var28 = JniRef<_jobject_*>::get((JniRef<_jobject_*> *)local_8f8);
  JNIEnv_::CallStaticVoidMethod((JNIEnv_ *)uVar5,p_Var22,(jmethodID)uVar3,p_Var29,p_Var30,p_Var28);
  checkJavaException((JNIEnv *)urlCls._16_8_);
  JniRef<_jobject_*>::~JniRef((JniRef<_jobject_*> *)local_8f8);
  JniRef<_jclass_*>::~JniRef((JniRef<_jclass_*> *)&jnaPointerInitId);
  JniRef<_jstring_*>::~JniRef((JniRef<_jstring_*> *)&jnaPointerCls.global);
  JniRef<_jstring_*>::~JniRef((JniRef<_jstring_*> *)&jmaster);
  JniRef<_jstring_*>::~JniRef((JniRef<_jstring_*> *)local_868);
  JniRef<_jclass_*>::~JniRef((JniRef<_jclass_*> *)&mainInitializeId);
  JniRef<_jobject_*>::~JniRef((JniRef<_jobject_*> *)&mainCls.global);
  JniRef<_jstring_*>::~JniRef((JniRef<_jstring_*> *)&classLoader.global);
  JniRef<_jobjectArray_*>::~JniRef((JniRef<_jobjectArray_*> *)local_7a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1_1);
  JniRef<_jclass_*>::~JniRef((JniRef<_jclass_*> *)&urlClassLoaderInitId);
  JniRef<_jclass_*>::~JniRef((JniRef<_jclass_*> *)&urlInitId);
  std::vector<JavaVMOption,_std::allocator<JavaVMOption>_>::~vector
            ((vector<JavaVMOption,_std::allocator<JavaVMOption>_> *)local_518);
  std::__cxx11::string::~string((string *)local_4a8);
  std::filesystem::__cxx11::path::~path((path *)local_408);
  std::__cxx11::string::~string((string *)&dlInfo.dli_saddr);
  std::filesystem::__cxx11::path::~path((path *)((long)&fbclientName.field_2 + 8));
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::string::~string((string *)local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&jnaLibPathOpt.field_2 + 8));
  iVar7 = std::__cxx11::string::~string
                    ((string *)
                     &jvmArgs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return iVar7;
}

Assistant:

static void init()
{
	string javaHome;
	vector<string> jvmArgs;
	const string jnaLibPathOpt("-Djna.library.path=");

	try
	{
		const auto status = fbUnique(master->getStatus());
		ThrowStatusWrapper st(status.get());

		if (const auto configManager = master->getConfigManager())
		{
			if (const auto config = fbUnique(configManager->getPluginConfig("JAVA")))
			{
				if (const auto entry = fbUnique(config->find(&st, "JavaHome")))
					javaHome = entry->getValue();

				if (const auto entry = fbUnique(config->find(&st, "JvmArgsFile")))
				{
					ifstream input(entry->getValue());
					string line;

					while (getline(input, line))
					{
						line = trim(line);

						if (!line.empty() && line[0] != '#')
							jvmArgs.push_back(line);
					}
				}
			}
		}
	}
	catch (const FbException&)
	{
		throw runtime_error("Error looking for JavaHome in the config file.");
	}

	string jnaLibPath;
#ifdef WIN32
	jnaLibPath = master->getConfigManager()->getRootDirectory();
#else
	jnaLibPath = master->getConfigManager()->getDirectory(IConfigManager::DIR_LIB);
#endif

	for (auto& arg : jvmArgs)
	{
		if (arg.length() >= jnaLibPathOpt.length() && arg.compare(0, jnaLibPathOpt.length(), jnaLibPathOpt) == 0)
		{
			arg.append(1, DEFAULT_PATH_SEPARATOR);
			arg.append(jnaLibPath);
			jnaLibPath.clear();
		}
	}

	if (!jnaLibPath.empty())
		jvmArgs.push_back(jnaLibPathOpt + jnaLibPath);

	fs::path libFile;
	string fbclientName;

#ifdef WIN32
	{	// scope
		char buffer[MAX_PATH];
		GetModuleFileName(hDllInstance, buffer, sizeof(buffer));
		libFile = buffer;

		HMODULE hMasterModule = nullptr;
		GetModuleHandleEx(GET_MODULE_HANDLE_EX_FLAG_FROM_ADDRESS, (LPCTSTR) master, &hMasterModule);
		GetModuleFileName(hMasterModule, buffer, sizeof(buffer));
		fbclientName = buffer;
	}
#else
	{	// scope
		Dl_info dlInfo;
		if (dladdr((void*) init, &dlInfo) == 0)
			throw runtime_error("Cannot get the plugin library path.");

		libFile = dlInfo.dli_fname;

		if (dladdr((void*) master, &dlInfo) == 0)
			throw runtime_error("Cannot get the fbclient library path.");

		fbclientName = dlInfo.dli_fname;
	}
#endif

	fs::path libDir(libFile.parent_path().parent_path() / "jar");

	if (javaHome.empty())
	{
		auto javaHomeEnv = getenv("JAVA_HOME");
		if (javaHomeEnv)
			javaHome = javaHomeEnv;
	}

	if (javaHome.empty())
		throw runtime_error("JAVA_HOME environment variable is not defined.");

	const auto jvmLibrary = findJvmLibrary(javaHome);

	if (jvmLibrary.empty())
		throw runtime_error("No JVM library found in '" + javaHome + "'.");

	library.reset(new DynLibrary(jvmLibrary));

	// JNI entrypoints
	jint (JNICALL *getCreatedJavaVMs)(JavaVM**, jsize, jsize*);
	library->findSymbol("JNI_GetCreatedJavaVMs", getCreatedJavaVMs);

	jint (JNICALL *createJavaVM)(JavaVM**, void**, void*);
	library->findSymbol("JNI_CreateJavaVM", createJavaVM);

	vector<JavaVMOption> vmOptions(jvmArgs.size());
	transform(jvmArgs.begin(), jvmArgs.end(), vmOptions.begin(),
		[](auto& arg) { return JavaVMOption{&arg[0], nullptr}; }
	);

	const auto jvmVersion = JNI_VERSION_1_4;

	JavaVMInitArgs vmArgs;
	memset(&vmArgs, 0, sizeof(vmArgs));
	vmArgs.version = jvmVersion;
	vmArgs.nOptions = vmOptions.size();
	vmArgs.options = vmOptions.data();
	vmArgs.ignoreUnrecognized = JNI_FALSE;

	JavaVM* jvm = nullptr;

	// Verify if there is already a JVM created. It happens, for example, using the embedded
	// engine in Java or if any other plugin has loaded it. If it was already loaded, we
	// don't do anything with the configured options.
	jsize jvmCount = 0;
	getCreatedJavaVMs(&jvm, 1, &jvmCount);

	if (jvmCount == 0)
	{
		// There is no JVM. Let's create one.
		JNIEnv* dummyEnv;
		auto jvmStatus = createJavaVM(&jvm, (void**) &dummyEnv, &vmArgs);

		if (jvmStatus != 0)
			throw runtime_error("Error creating JVM.");
	}

	JNIEnv* env;

	if (jvm->GetEnv((void**) &env, jvmVersion) == JNI_EDETACHED)
	{
		if (jvm->AttachCurrentThread((void**) &env, nullptr) != JNI_OK)
			throw runtime_error("Cannot attach the current thread to the JVM.");
	}

	// Lets create an URL classloader for the plugin.

	const auto urlCls = findClass(env, "java/net/URL", false);
	const auto urlInitId = getMethodID(env, urlCls.get(), "<init>", "(Ljava/lang/String;)V");

	const auto urlClassLoaderCls = findClass(env, "java/net/URLClassLoader", false);
	const auto urlClassLoaderInitId = getMethodID(env, urlClassLoaderCls.get(), "<init>",
		"([Ljava/net/URL;)V");
	const auto urlClassLoaderLoadClassId = getMethodID(env, urlClassLoaderCls.get(), "loadClass",
		"(Ljava/lang/String;Z)Ljava/lang/Class;");

	vector<string> classPathEntries;

	for (const auto& dirEntry : fs::directory_iterator(libDir))
	{
		if (dirEntry.is_regular_file())
		{
			const string name = dirEntry.path().filename().string();

			if (name.length() > 4 && name.substr(name.length() - 4) == ".jar")
			{
				string protocol("file://");

#ifdef WIN32
				protocol += "/";
#endif

				classPathEntries.push_back(protocol + dirEntry.path().string());
			}
		}
	}

	if (classPathEntries.empty())
		throw runtime_error("Cannot set the classpath. Directory '" + libDir.string() + "' does not exist.");

	const auto urlArray = jniLocalRef(env, env->NewObjectArray(classPathEntries.size(), urlCls.get(), nullptr));
	if (!urlArray)
		checkJavaException(env);

	{	// scope
		unsigned i = 0;

		for (const auto& classPathEntry : classPathEntries)
		{
			const auto str = jniLocalRef(env, env->NewStringUTF(classPathEntry.c_str()));
			if (!str)
				checkJavaException(env);

			const auto url = jniLocalRef(env, env->NewObject(urlCls.get(), urlInitId, str.get()));
			if (!url)
				checkJavaException(env);

			env->SetObjectArrayElement(urlArray.get(), i++, url.get());
			checkJavaException(env);
		}
	}

	// Call org.firebirdsql.fbjava.impl.Main.initialize(String, String, Pointer)

	const auto mainClassName = jniLocalRef(env, env->NewStringUTF("org.firebirdsql.fbjava.impl.Main"));
	if (!mainClassName)
		checkJavaException(env);

	const auto classLoader = jniLocalRef(env,
		env->NewObject(urlClassLoaderCls.get(), urlClassLoaderInitId, urlArray.get()));
	if (!classLoader)
		checkJavaException(env);

	const auto mainCls = jniLocalRef(env, (jclass) env->CallObjectMethod(classLoader.get(), urlClassLoaderLoadClassId,
		mainClassName.get(), true));
	if (!mainCls)
		checkJavaException(env);

	const auto mainInitializeId = getStaticMethodID(env, mainCls.get(), "initialize", "(Ljava/lang/String;Ljava/lang/String;Lcom/sun/jna/Pointer;)V");
	checkJavaException(env);

	const auto nativeLibrary = jniLocalRef(env, env->NewStringUTF(libFile.string().c_str()));
	if (!nativeLibrary)
		checkJavaException(env);

	const auto fbclientLibrary = jniLocalRef(env, env->NewStringUTF(fbclientName.c_str()));
	if (!fbclientLibrary)
		checkJavaException(env);

	// create a pointer to the IMaster interface
	const auto jmaster = (jlong)(master);

	const auto jnaPointerName = jniLocalRef(env, env->NewStringUTF("com.sun.jna.Pointer"));
	if (!jnaPointerName)
		checkJavaException(env);
	const auto jnaPointerCls = jniLocalRef(env, (jclass) env->CallObjectMethod(classLoader.get(), urlClassLoaderLoadClassId,
		jnaPointerName.get(), true));
	if (!jnaPointerCls)
		checkJavaException(env);

	const auto jnaPointerInitId = getMethodID(env, jnaPointerCls.get(), "<init>", "(J)V");
	const auto masterPointer =  jniLocalRef(env, env->NewObject(jnaPointerCls.get(), jnaPointerInitId, jmaster));
	if (!masterPointer)
		checkJavaException(env);

	env->CallStaticVoidMethod(mainCls.get(), mainInitializeId, nativeLibrary.get(), fbclientLibrary.get(), masterPointer.get());
	checkJavaException(env);
}